

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

bool __thiscall Tokenizer::tryToSkipComments(Tokenizer *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  bool result;
  undefined7 in_stack_ffffffffffffffe0;
  byte in_stack_ffffffffffffffe7;
  bool local_9;
  
  local_9 = false;
  while( true ) {
    cVar1 = Stream::peek((Stream *)0x163dc2);
    if (cVar1 != '/') {
      return local_9;
    }
    iVar3 = Stream::advance((Stream *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0))
    ;
    if (iVar3 != 0x2f) break;
    local_9 = true;
    while( true ) {
      cVar1 = Stream::peek((Stream *)0x163de8);
      in_stack_ffffffffffffffe7 = 0;
      if (cVar1 != '\n') {
        bVar2 = Stream::eof((Stream *)0x163e00);
        in_stack_ffffffffffffffe7 = bVar2 ^ 0xff;
      }
      if ((in_stack_ffffffffffffffe7 & 1) == 0) break;
      Stream::advance((Stream *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
    }
    Stream::advance((Stream *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  }
  Stream::unget((Stream *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0));
  return local_9;
}

Assistant:

bool Tokenizer::tryToSkipComments()
{
  bool result = false;
  while(stream_.peek() == '/')
  {
    if(stream_.advance() == '/')
    {
      result = true;
      while(stream_.peek() != '\n' && !stream_.eof())
        stream_.advance();
      stream_.advance();
    }
    else
    {
      stream_.unget();
      break;
    }
  }

  return result;
}